

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O3

void __thiscall QFbCursor::pointerEvent(QFbCursor *this,QMouseEvent *e)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  QRect QVar6;
  undefined1 auVar7 [16];
  QRect local_28;
  long local_18;
  
  QVar6._8_8_ = local_28._8_8_;
  QVar6._0_8_ = local_28._0_8_;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(e + 8) == 5) {
    auVar7 = QEventPoint::globalPosition();
    QVar6.x2.m_i = local_28.x2.m_i;
    QVar6.y2.m_i = local_28.y2.m_i;
    QVar6.x1.m_i = local_28.x1.m_i;
    QVar6.y1.m_i = local_28.y1.m_i;
    dVar5 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_;
    bVar1 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    dVar4 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_;
    bVar2 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    *(ulong *)(this + 0x58) =
         CONCAT44((int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar4),
                  (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5))
    ;
    if (this[0x10] == (QFbCursor)0x1) {
      QVar6 = getCurrentRect(this);
      *(QRect *)(this + 0x20) = QVar6;
      if (this[0x41] == (QFbCursor)0x0) {
        local_28 = (QRect)(**(code **)(**(long **)(this + 0x18) + 0x68))();
        (**(code **)(**(long **)(this + 0x18) + 0x68))();
        cVar3 = QRect::intersects(&local_28);
        QVar6 = local_28;
        if (cVar3 == '\0') goto LAB_001124d6;
      }
      (**(code **)(*(long *)this + 0xa0))(this);
      QVar6 = local_28;
    }
  }
LAB_001124d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  local_28 = QVar6;
  __stack_chk_fail();
}

Assistant:

void QFbCursor::pointerEvent(const QMouseEvent &e)
{
    if (e.type() != QEvent::MouseMove)
        return;
    m_pos = e.globalPosition().toPoint();
    if (!mVisible)
        return;
    mCurrentRect = getCurrentRect();
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreen->geometry().topLeft())))
        setDirty();
}